

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall SGParser::Generator::RegExprNFAParseElement::Destroy(RegExprNFAParseElement *this)

{
  NFA *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  RegExprNFAParseElement *this_local;
  
  switch(this->DataType) {
  case Null:
    break;
  case NFA:
    this_00 = (this->field_1).pNFA;
    if (this_00 != (NFA *)0x0) {
      NFA::~NFA(this_00);
      operator_delete(this_00,0x28);
    }
    break;
  case Vector:
    this_01 = (this->field_1).pVec;
    if (this_01 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_01);
      operator_delete(this_01,0x18);
    }
    break;
  case Char:
  }
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Null:                break;
            case RegExprDataType::NFA:    delete pNFA; break;
            case RegExprDataType::Vector: delete pVec; break;
            case RegExprDataType::Char:                break;
        }
        DataType = RegExprDataType::Null;
    }